

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parse_error * __thiscall
nlohmann::detail::parse_error::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (parse_error *__return_storage_ptr__,parse_error *this,int id_,position_t *pos,
          string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  size_t sVar1;
  parse_error *this_00;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *puVar5;
  size_type *psVar6;
  undefined4 in_register_00000014;
  parse_error *ppVar7;
  ulong uVar8;
  undefined8 uVar9;
  string local_160;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  parse_error *local_120;
  parse_error *local_118;
  size_type *local_110;
  string w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  ulong *local_b0;
  position_t *local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  ulong *local_50;
  ulong local_48;
  ulong local_40;
  long lStack_38;
  
  ppVar7 = (parse_error *)CONCAT44(in_register_00000014,id_);
  w.field_2._8_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&w.field_2 + 8),"parse_error","")
  ;
  exception::name(&local_160,(string *)((long)&w.field_2 + 8),(int)this);
  local_120 = __return_storage_ptr__;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_a0 = *puVar5;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar5;
    local_b0 = (ulong *)*plVar2;
  }
  local_a8 = (position_t *)plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  position_string_abi_cxx11_(&local_d0,ppVar7,local_a8);
  uVar4 = (long)&local_a8->chars_read_total + local_d0._M_string_length;
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < uVar4) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar9 = local_d0.field_2._M_allocated_capacity;
    }
    if (uVar4 <= (ulong)uVar9) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00113447;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
LAB_00113447:
  local_70 = &local_60;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_60 = *plVar2;
    uStack_58 = puVar3[3];
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*puVar3;
  }
  local_68 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_40 = *puVar5;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar5;
    local_50 = (ulong *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_138 = 0;
  local_130 = 0;
  uVar4 = 0xf;
  if (local_50 != &local_40) {
    uVar4 = local_40;
  }
  local_140 = &local_130;
  local_118 = ppVar7;
  if ((local_48 < 0x10) && (uVar4 < local_48)) {
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_50);
  }
  else {
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)&local_130);
  }
  local_90 = &local_80;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = puVar3[3];
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*puVar3;
  }
  local_88 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_90,pos->chars_read_total);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    w._M_string_length = *psVar6;
    w.field_2._M_allocated_capacity = plVar2[3];
    local_110 = &w._M_string_length;
  }
  else {
    w._M_string_length = *psVar6;
    local_110 = (size_type *)*plVar2;
  }
  w._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  ppVar7 = local_118;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  this_00 = local_120;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)w.field_2._8_8_ != &local_e0) {
    operator_delete((void *)w.field_2._8_8_,local_e0._M_allocated_capacity + 1);
  }
  sVar1 = *(size_t *)&ppVar7->super_exception;
  exception::exception(&this_00->super_exception,(int)this,(char *)local_110);
  *(undefined ***)&this_00->super_exception = &PTR__exception_00124c50;
  this_00->byte = sVar1;
  if (local_110 != &w._M_string_length) {
    operator_delete(local_110,w._M_string_length + 1);
  }
  return this_00;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + exception::diagnostics(context) + what_arg;
        return parse_error(id_, pos.chars_read_total, w.c_str());
    }